

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_try_recv(amqp_connection_state_t state)

{
  amqp_boolean_t aVar1;
  amqp_connection_state_t in_RDI;
  amqp_link_t *link;
  amqp_frame_t *frame_copy;
  amqp_pool_t *channel_pool;
  amqp_frame_t frame;
  int res;
  amqp_time_t timeout;
  size_t in_stack_ffffffffffffff90;
  amqp_connection_state_t in_stack_ffffffffffffff98;
  amqp_connection_state_t in_stack_ffffffffffffffa0;
  amqp_time_t in_stack_ffffffffffffffa8;
  char local_50 [52];
  int local_1c;
  amqp_connection_state_t local_10;
  int local_4;
  
  local_10 = in_RDI;
  while( true ) {
    do {
      aVar1 = amqp_data_in_buffer(local_10);
      if (aVar1 == 0) {
        local_1c = amqp_time_from_now((amqp_time_t *)in_stack_ffffffffffffffa8.time_point_ns,
                                      (timeval *)in_stack_ffffffffffffffa0);
        local_4 = local_1c;
        if (local_1c == 0) {
          local_4 = recv_with_timeout(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
        }
        return local_4;
      }
      local_1c = consume_one_frame((amqp_connection_state_t)in_stack_ffffffffffffffa8.time_point_ns,
                                   (amqp_frame_t *)in_stack_ffffffffffffffa0);
      if (local_1c != 0) {
        return local_1c;
      }
    } while (local_50[0] == '\0');
    in_stack_ffffffffffffffa8.time_point_ns =
         (uint64_t)
         amqp_get_or_create_channel_pool
                   (in_stack_ffffffffffffff98,(amqp_channel_t)(in_stack_ffffffffffffff90 >> 0x30));
    if ((amqp_connection_state_t)in_stack_ffffffffffffffa8.time_point_ns ==
        (amqp_connection_state_t)0x0) {
      return -1;
    }
    in_stack_ffffffffffffffa0 =
         (amqp_connection_state_t)
         amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff98 =
         (amqp_connection_state_t)
         amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if ((in_stack_ffffffffffffffa0 == (amqp_connection_state_t)0x0) ||
       (in_stack_ffffffffffffff98 == (amqp_connection_state_t)0x0)) break;
    memcpy(in_stack_ffffffffffffffa0,local_50,0x30);
    in_stack_ffffffffffffff98->pool_table[0] = (amqp_pool_table_entry_t *)0x0;
    in_stack_ffffffffffffff98->pool_table[1] = (amqp_pool_table_entry_t *)in_stack_ffffffffffffffa0;
    if (local_10->last_queued_frame == (amqp_link_t *)0x0) {
      local_10->first_queued_frame = (amqp_link_t *)in_stack_ffffffffffffff98;
    }
    else {
      local_10->last_queued_frame->next = (amqp_link_t_ *)in_stack_ffffffffffffff98;
    }
    local_10->last_queued_frame = (amqp_link_t *)in_stack_ffffffffffffff98;
  }
  return -1;
}

Assistant:

int amqp_try_recv(amqp_connection_state_t state) {
  amqp_time_t timeout;
  int res;

  while (amqp_data_in_buffer(state)) {
    amqp_frame_t frame;
    res = consume_one_frame(state, &frame);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (frame.frame_type != 0) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;
    }
  }
  res = amqp_time_from_now(&timeout, &(struct timeval){0});
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  return recv_with_timeout(state, timeout);
}